

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O1

void __thiscall xray_re::xr_skl_motion::xr_skl_motion(xr_skl_motion *this)

{
  xr_motion::xr_motion(&this->super_xr_motion,MT_SKELETON);
  (this->super_xr_motion)._vptr_xr_motion = (_func_int **)&PTR__xr_skl_motion_0024a268;
  (this->m_bone_motions).
  super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_bone_motions).
  super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_bone_motions).
  super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_bone_or_part = 0xffff;
  this->m_speed = 1.0;
  this->m_accrue = 2.0;
  this->m_falloff = 2.0;
  this->m_power = 1.0;
  *(undefined8 *)&this->m_flags = 0;
  *(undefined8 *)
   ((long)&(this->m_marks).
           super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->m_marks).
  super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_marks).
  super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

xr_skl_motion::xr_skl_motion(): xr_motion(MT_SKELETON),
	m_bone_or_part(ALL_PARTITIONS),
	m_speed(1.f), m_accrue(2.f), m_falloff(2.f), m_power(1.f),
	m_flags(0) {}